

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

QList<QAbstractButton_*> * __thiscall
QtMWidgets::MessageBox::buttons
          (QList<QAbstractButton_*> *__return_storage_ptr__,MessageBox *this,ButtonRole role)

{
  QMapData<std::map<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole,_std::less<QAbstractButton_*>,_std::allocator<std::pair<QAbstractButton_*const,_QtMWidgets::MessageBox::ButtonRole>_>_>_>
  *pQVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAbstractButton **)0x0;
  pQVar1 = (((this->d).d)->buttonsMap).d.d;
  if (pQVar1 == (QMapData<std::map<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole,_std::less<QAbstractButton_*>,_std::allocator<std::pair<QAbstractButton_*const,_QtMWidgets::MessageBox::ButtonRole>_>_>_>
                 *)0x0) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  p_Var3 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole,_std::less<QAbstractButton_*>,_std::allocator<std::pair<QAbstractButton_*const,_QtMWidgets::MessageBox::ButtonRole>_>_>_>
                 *)0x0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var2 != p_Var3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(ButtonRole *)&p_Var2[1]._M_parent == role) {
      QList<QAbstractButton_*>::append(__return_storage_ptr__,*(parameter_type *)(p_Var2 + 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QList< QAbstractButton* >
MessageBox::buttons( ButtonRole role ) const
{
	QList< QAbstractButton* > list;

	for( QMap< QAbstractButton*, ButtonRole >::const_iterator
		it = d->buttonsMap.constBegin(), last = d->buttonsMap.constEnd();
		it != last; ++it )
	{
		if( it.value() == role )
			list.append( it.key() );
	}

	return list;
}